

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsRandomShaderCase.cpp
# Opt level: O2

void __thiscall
deqp::gls::RandomShaderCase::checkShaderLimits(RandomShaderCase *this,Shader *shader)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  NotSupportedError *this_00;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  int numSupported;
  int numRequiredSamplers;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  string local_40;
  
  iVar1 = getNumSamplerUniforms(&shader->m_uniforms);
  if (0 < iVar1) {
    uVar3 = 0x8872;
    if (shader->m_type == TYPE_VERTEX) {
      uVar3 = 0x8b4c;
    }
    numSupported = -1;
    numRequiredSamplers = iVar1;
    iVar2 = (*this->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar2) + 0x868))(uVar3,&numSupported);
    iVar2 = (*this->m_renderCtx->_vptr_RenderContext[3])();
    local_80._M_string_length._0_4_ = (**(code **)(CONCAT44(extraout_var_00,iVar2) + 0x800))();
    if ((int)local_80._M_string_length != 0) {
      auVar4 = __cxa_allocate_exception(0x38);
      local_80._M_dataplus._M_p = (pointer)glu::getErrorName;
      de::toString<tcu::Format::Enum<int,2ul>>(&local_c0,(de *)&local_80,auVar4._8_8_);
      std::operator+(&local_a0,"Limit query failed: ",&local_c0);
      tcu::TestError::TestError(auVar4._0_8_,&local_a0);
      __cxa_throw(auVar4._0_8_,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    if (numSupported < iVar1) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      de::toString<int>(&local_40,&numRequiredSamplers);
      std::operator+(&local_80,"Shader requires ",&local_40);
      std::operator+(&local_c0,&local_80," sampler(s). Implementation supports ");
      de::toString<int>(&local_60,&numSupported);
      std::operator+(&local_a0,&local_c0,&local_60);
      tcu::NotSupportedError::NotSupportedError(this_00,&local_a0);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  return;
}

Assistant:

void RandomShaderCase::checkShaderLimits (const rsg::Shader& shader) const
{
	const int numRequiredSamplers = getNumSamplerUniforms(shader.getUniforms());

	if (numRequiredSamplers > 0)
	{
		const GLenum	pname			= (shader.getType() == rsg::Shader::TYPE_VERTEX) ? (GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS) : (GL_MAX_TEXTURE_IMAGE_UNITS);
		int				numSupported	= -1;
		GLenum			error;

		m_renderCtx.getFunctions().getIntegerv(pname, &numSupported);
		error = m_renderCtx.getFunctions().getError();

		if (error != GL_NO_ERROR)
			throw tcu::TestError("Limit query failed: " + de::toString(glu::getErrorStr(error)));

		if (numSupported < numRequiredSamplers)
			throw tcu::NotSupportedError("Shader requires " + de::toString(numRequiredSamplers) + " sampler(s). Implementation supports " + de::toString(numSupported));
	}
}